

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O1

LineInterpolationMethod
tcu::verifyLineGroupInterpolation
          (Surface *surface,LineSceneSpec *scene,RasterizationArguments *args,TestLog *log)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  RGBA RVar4;
  undefined8 uVar5;
  RasterizationArguments *pRVar6;
  bool bVar7;
  int i_1;
  float fVar8;
  long lVar9;
  Surface *pSVar10;
  pointer pSVar11;
  allocator_type *paVar12;
  allocator_type *paVar13;
  ostream *poVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  ushort uVar18;
  uint uVar19;
  ulong uVar20;
  SingleSampleWideLineCandidate *__args;
  SingleSampleWideLineCandidate *extraout_RDX;
  allocator_type *paVar21;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int dy;
  int iVar22;
  allocator_type *paVar23;
  allocator_type *paVar24;
  ChannelOrder CVar25;
  allocator_type *paVar26;
  allocator_type *paVar27;
  ulong uVar28;
  allocator_type *paVar29;
  undefined8 uVar30;
  allocator_type *paVar31;
  undefined1 auVar32 [8];
  allocator_type *paVar33;
  allocator_type *paVar34;
  allocator_type *paVar35;
  allocator_type *paVar36;
  allocator_type *paVar37;
  allocator_type *paVar38;
  ostringstream *poVar39;
  allocator_type *paVar40;
  int iVar41;
  int iVar42;
  allocator_type *paVar43;
  long lVar44;
  int i_7;
  long lVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  Vec4 valueMax;
  RGBA color;
  int numRasterized;
  IVec2 rootPosition;
  Vec2 offset;
  Vector<float,_4> res_7;
  IVec2 idealRootPos;
  IVec3 formatLimit;
  Vec2 pb;
  IVec2 minorDirection;
  vector<bool,_std::allocator<bool>_> lineIsXMajor;
  Surface errorMask;
  IVec2 viewportSize;
  Vec2 pa;
  IVec3 pixelNativeColor;
  Vector<float,_3> res_16;
  Vector<float,_3> res_15;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> effectiveLines;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> screenspaceLines;
  Vec2 offsetDirection;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  rootPixelLocation;
  TextureLevel referenceLineMap;
  allocator_type *local_5f8;
  int local_5ec;
  int local_5d4;
  undefined1 local_5c8 [8];
  TextureFormat TStack_5c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b8;
  allocator_type *local_5a8;
  allocator_type *local_5a0;
  ulong local_598;
  RGBA local_58c;
  undefined1 local_588 [16];
  string local_578;
  allocator_type *local_558;
  allocator_type *local_550;
  allocator_type *local_548;
  undefined8 local_540;
  undefined4 local_538;
  ulong local_530;
  RasterizationArguments *local_528;
  allocator_type *local_520;
  undefined1 local_518 [8];
  TextureFormat TStack_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  _Alloc_hider local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  ulong local_4a0;
  string local_498;
  Vector<float,_3> local_478;
  undefined1 local_468 [16];
  ulong local_458;
  allocator_type *local_450;
  allocator_type *local_448;
  allocator_type *local_440;
  allocator_type *local_438;
  allocator_type *local_430;
  allocator_type *local_428;
  allocator_type *local_420;
  allocator_type *local_418;
  ulong local_410;
  string local_408;
  IVec2 local_3e8;
  undefined4 local_3e0;
  ulong local_3dc;
  undefined4 local_3d4;
  vector<bool,_std::allocator<bool>_> local_3d0;
  undefined1 local_3a8 [16];
  Surface local_398;
  allocator_type *local_380;
  long local_378;
  long local_370;
  IVec2 local_368;
  string local_360;
  string local_340;
  Vector<float,_3> local_320;
  Vector<float,_3> local_310;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_300;
  undefined1 local_2e8 [20];
  int aiStack_2d4 [3];
  _Alloc_hider local_2c8;
  int aiStack_2c0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined4 auStack_2a8 [14];
  ios_base local_270 [264];
  undefined1 local_168 [8];
  undefined8 uStack_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [6];
  ulong local_d0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_c8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_a4;
  undefined4 local_9c;
  undefined8 local_98;
  undefined4 local_90;
  undefined8 local_8c;
  undefined4 local_84;
  TextureLevel local_80;
  PixelBufferAccess local_58;
  
  if (args->numSamples != 0) {
    bVar7 = anon_unknown_3::verifyMultisampleLineGroupInterpolation(surface,scene,args,log);
    return (uint)!bVar7 * 2;
  }
  local_528 = args;
  if ((scene->lineWidth == 1.0) && (!NAN(scene->lineWidth))) {
    bVar7 = anon_unknown_3::verifyLineGroupPixelIndependentInterpolation
                      (surface,scene,args,log,LINEINTERPOLATION_STRICTLY_CORRECT);
    if (bVar7) {
      return LINEINTERPOLATION_STRICTLY_CORRECT;
    }
    goto LAB_00a8a8d9;
  }
  local_368.m_data[0] = surface->m_width;
  local_368.m_data[1] = surface->m_height;
  Surface::Surface(&local_398,local_368.m_data[0],local_368.m_data[1]);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_300,
             (long)(scene->lines).
                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(scene->lines).
                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)local_2e8);
  local_2e8._0_8_ = local_2e8._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_3d0,
             (long)(scene->lines).
                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(scene->lines).
                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6,(bool *)local_2e8,
             (allocator_type *)local_168);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_c8,
           (long)(scene->lines).
                 super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(scene->lines).
                 super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)local_2e8);
  poVar39 = (ostringstream *)(local_2e8 + 8);
  local_2e8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar39);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar39,"Verifying rasterization result. Native format is RGB",0x34);
  pRVar6 = local_528;
  std::ostream::operator<<(poVar39,local_528->redBits);
  std::ostream::operator<<(poVar39,pRVar6->greenBits);
  std::ostream::operator<<(poVar39,pRVar6->blueBits);
  MessageBuilder::operator<<((MessageBuilder *)local_2e8,(EndMessageToken *)&TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar39);
  std::ios_base::~ios_base(local_270);
  if ((8 < pRVar6->redBits) || ((8 < pRVar6->greenBits || (8 < pRVar6->blueBits)))) {
    poVar39 = (ostringstream *)(local_2e8 + 8);
    local_2e8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar39);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar39,
               "Warning! More than 8 bits in a color channel, this may produce false negatives.",
               0x4f);
    MessageBuilder::operator<<((MessageBuilder *)local_2e8,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar39);
    std::ios_base::~ios_base(local_270);
  }
  local_2e8._0_4_ = R;
  local_2e8._4_4_ = UNSIGNED_INT8;
  TextureLevel::TextureLevel
            (&local_80,(TextureFormat *)local_2e8,surface->m_width,surface->m_height,1);
  TextureLevel::getAccess((PixelBufferAccess *)local_2e8,&local_80);
  local_168._0_4_ = R;
  local_168._4_4_ = SNORM_INT8;
  uStack_160 = 0;
  clear((PixelBufferAccess *)local_2e8,(IVec4 *)local_168);
  local_168._0_4_ = RGBA;
  local_168._4_4_ = UNORM_INT8;
  if ((void *)local_398.m_pixels.m_cap != (void *)0x0) {
    local_398.m_pixels.m_cap = (size_t)local_398.m_pixels.m_ptr;
  }
  PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_2e8,(TextureFormat *)local_168,local_398.m_width,
             local_398.m_height,1,(void *)local_398.m_pixels.m_cap);
  local_168._0_4_ = R;
  local_168._4_4_ = SNORM_INT8;
  uStack_160 = 0x3f80000000000000;
  clear((PixelBufferAccess *)local_2e8,(Vec4 *)local_168);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_2e8,
             (long)(scene->lines).
                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(scene->lines).
                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)local_168);
  anon_unknown_3::genScreenSpaceLines
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_2e8,
             &scene->lines,&local_368);
  local_588._0_4_ = scene->lineWidth;
  TextureLevel::getAccess(&local_58,&local_80);
  anon_unknown_3::setMaskMapCoverageBitForLines
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_2e8,
             (float)local_588._0_4_,&local_58);
  if (0 < (int)((ulong)((long)(scene->lines).
                              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(scene->lines).
                             super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    uVar17 = 0;
    do {
      lVar9 = uVar17 * 0x10;
      fVar46 = *(float *)&((TestLog *)(local_2e8._0_8_ + lVar9))->m_log;
      fVar8 = *(float *)((undefined1 *)(local_2e8._0_8_ + 4) + lVar9);
      fVar47 = *(float *)&((TestLog *)(local_2e8._0_8_ + 8))[uVar17 * 2].m_log;
      fVar48 = *(float *)((undefined1 *)(local_2e8._0_8_ + 0xc) + lVar9);
      fVar49 = fVar47 - fVar46;
      fVar51 = -fVar49;
      if (-fVar49 <= fVar49) {
        fVar51 = fVar49;
      }
      fVar50 = fVar48 - fVar8;
      fVar49 = -fVar50;
      if (-fVar50 <= fVar50) {
        fVar49 = fVar50;
      }
      uVar28 = 1L << ((byte)uVar17 & 0x3f);
      uVar20 = uVar17 >> 6;
      if (fVar49 <= fVar51) {
        uVar28 = uVar28 | local_3d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar20];
        local_168._0_4_ = R;
        local_168._4_4_ = 0xbf800000;
      }
      else {
        uVar28 = ~uVar28 & local_3d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar20];
        local_168._4_4_ = R;
        local_168._0_4_ = 0xbf800000;
      }
      local_3d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p[uVar20] = uVar28;
      fVar51 = scene->lineWidth;
      local_518 = (undefined1  [8])0x0;
      lVar9 = 0;
      do {
        *(float *)(local_518 + lVar9 * 4) =
             *(float *)(local_168 + lVar9 * 4) * (fVar51 + -1.0) * 0.5;
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_300.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar17].m_data[0] = fVar46 + (float)local_518._0_4_;
      local_300.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar17].m_data[1] = fVar8 + (float)local_518._4_4_;
      local_300.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar17].m_data[2] = fVar47 + (float)local_518._0_4_;
      local_300.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar17].m_data[3] = fVar48 + (float)local_518._4_4_;
      uVar17 = uVar17 + 1;
    } while ((long)uVar17 <
             (long)(int)((ulong)((long)(scene->lines).
                                       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(scene->lines).
                                      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 6));
  }
  if ((TextureFormat)local_2e8._0_8_ != (TextureFormat)0x0) {
    operator_delete((void *)local_2e8._0_8_,stack0xfffffffffffffd28 - local_2e8._0_8_);
  }
  if (0 < (int)((ulong)((long)(scene->lines).
                              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(scene->lines).
                             super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    uVar17 = 0;
    local_4d8._0_8_ = &surface->m_height;
    do {
      uVar20 = 1L << ((byte)uVar17 & 0x3f) &
               local_3d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p[uVar17 >> 6];
      pSVar10 = (Surface *)local_4d8._0_8_;
      if (uVar20 != 0) {
        pSVar10 = surface;
      }
      iVar22 = pSVar10->m_width;
      rr::LineExitDiamondGenerator::LineExitDiamondGenerator((LineExitDiamondGenerator *)local_168);
      memset((LineExitDiamond *)local_2e8,0,0x100);
      local_588._0_8_ = uVar17;
      lVar44 = (ulong)(uVar20 == 0) * 4;
      lVar9 = (ulong)(uVar20 != 0) * 4;
      local_578._M_dataplus._M_p._0_4_ = 0x20;
      local_518._4_4_ =
           local_300.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar17].m_data[1];
      local_518._0_4_ =
           local_300.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar17].m_data[0];
      local_5c8._4_4_ =
           local_300.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar17].m_data[3];
      local_5c8._0_4_ =
           local_300.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar17].m_data[2];
      fVar46 = (-1.0 - *(float *)(local_518 + lVar44)) *
               ((*(float *)(local_5c8 + lVar9) - *(float *)(local_518 + lVar9)) /
               (*(float *)(local_5c8 + lVar44) - *(float *)(local_518 + lVar44))) +
               *(float *)(local_518 + lVar9);
      if (uVar20 != 0) {
        fVar8 = -1.0;
      }
      else {
        fVar8 = fVar46;
        fVar46 = -1.0;
      }
      local_5c8._0_4_ = (float)iVar22 + 1.0;
      fVar47 = ((float)local_5c8._0_4_ - *(float *)(local_518 + lVar44)) *
               ((*(float *)(local_5c8 + lVar9) - *(float *)(local_518 + lVar9)) /
               (*(float *)(local_5c8 + lVar44) - *(float *)(local_518 + lVar44))) +
               *(float *)(local_518 + lVar9);
      local_5c8._4_4_ = fVar47;
      if (uVar20 == 0) {
        local_5c8._4_4_ = local_5c8._0_4_;
        local_5c8._0_4_ = fVar47;
      }
      TStack_510.order = R;
      TStack_510.type = 0x3f800000;
      TStack_5c0.order = R;
      TStack_5c0.type = 0x3f800000;
      local_518._0_4_ = fVar8;
      local_518._4_4_ = fVar46;
      rr::LineExitDiamondGenerator::init
                ((LineExitDiamondGenerator *)local_168,(EVP_PKEY_CTX *)local_518);
      uVar30 = local_588._0_8_;
      local_518._0_4_ = 0x10000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (local_c8.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + local_588._0_8_,(long)iVar22,
                 (value_type_conflict1 *)local_518);
      uVar5 = local_588._0_8_;
      while ((int)local_578._M_dataplus._M_p == 0x20) {
        rr::LineExitDiamondGenerator::rasterize
                  ((LineExitDiamondGenerator *)local_168,(LineExitDiamond *)local_2e8,0x20,
                   (int *)&local_578);
        if (0 < (int)local_578._M_dataplus._M_p) {
          lVar9 = 0;
          do {
            uVar19 = *(uint *)(local_2e8 + lVar9 * 8 + 4);
            if (uVar20 != 0) {
              uVar19 = *(uint *)(local_2e8 + lVar9 * 8);
            }
            if ((int)uVar19 < iVar22 && -1 < (int)uVar19) {
              uVar18 = (ushort)*(uint *)(local_2e8 + lVar9 * 8);
              if (uVar20 != 0) {
                uVar18 = (ushort)*(uint *)(local_2e8 + lVar9 * 8 + 4);
              }
              local_c8.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar30].
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar19] = (uint)uVar18;
            }
            lVar9 = lVar9 + 1;
          } while ((int)lVar9 < (int)local_578._M_dataplus._M_p);
        }
      }
      rr::LineExitDiamondGenerator::~LineExitDiamondGenerator((LineExitDiamondGenerator *)local_168)
      ;
      uVar17 = uVar5 + 1;
    } while ((long)uVar17 <
             (long)(int)((ulong)((long)(scene->lines).
                                       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(scene->lines).
                                      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 6));
  }
  local_5d4 = 0;
  local_5ec = 0;
  if (1 < surface->m_height + -1) {
    local_5ec = 0;
    local_598 = 1;
    local_5d4 = 0;
    do {
      iVar22 = surface->m_width;
      if (1 < iVar22 + -1) {
        fVar46 = 1.4013e-45;
        local_410 = 0;
        do {
          pRVar6 = local_528;
          local_58c.m_value =
               *(uint *)((long)(surface->m_pixels).m_ptr +
                        (long)(iVar22 * (int)local_598 + (int)fVar46) * 4);
          anon_unknown_3::convertRGB8ToNativeFormat
                    ((anon_unknown_3 *)&local_340,&local_58c,local_528);
          iVar22 = -1;
          local_408._M_dataplus._M_p._4_4_ = ~(-1 << ((byte)pRVar6->greenBits & 0x1f));
          local_408._M_dataplus._M_p._0_4_ = ~(-1 << ((byte)pRVar6->redBits & 0x1f));
          local_408._M_string_length =
               CONCAT44(local_408._M_string_length._4_4_,~(-1 << ((byte)pRVar6->blueBits & 0x1f)));
          CVar25 = 0xffff;
          local_4a0 = local_4a0 & 0xffffffff00000000;
          do {
            iVar16 = (int)local_598;
            iVar41 = 0;
            do {
              TextureLevel::getAccess((PixelBufferAccess *)local_2e8,&local_80);
              ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)local_168,(int)(PixelBufferAccess *)local_2e8,
                         (int)local_410 + iVar41,iVar22 + iVar16);
              local_4a0 = CONCAT44(local_4a0._4_4_,(ChannelOrder)local_4a0 | local_168._0_4_);
              CVar25 = CVar25 & local_168._0_4_;
              iVar41 = iVar41 + 1;
            } while (iVar41 != 3);
            iVar22 = iVar22 + 1;
          } while (iVar22 != 2);
          if (CVar25 == R) {
            local_2e8._0_4_ = 0xff000000;
            bVar7 = anon_unknown_3::compareColors
                              (&local_58c,(RGBA *)local_2e8,local_528->redBits,local_528->greenBits,
                               local_528->blueBits);
            if (!bVar7) goto LAB_00a88c47;
            local_5f8 = (allocator_type *)0x0;
            local_5a8 = (allocator_type *)0x0;
          }
          else {
LAB_00a88c47:
            pSVar11 = (scene->lines).
                      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((int)((ulong)((long)(scene->lines).
                                    super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar11) >> 6
                     ) < 1) {
              local_5f8 = (allocator_type *)0x0;
              local_558 = (allocator_type *)0x0;
              local_5a8 = (allocator_type *)0x0;
              local_530 = 0;
            }
            else {
              local_370 = 0x20;
              local_378 = 0x30;
              local_5f8 = (allocator_type *)0x0;
              uVar17 = 0;
              local_5a8 = (allocator_type *)0x0;
              local_558 = (allocator_type *)0x0;
              local_530 = 0;
              do {
                if (((ChannelOrder)local_4a0 >> ((uint)uVar17 & 0x1f) & 1) != 0) {
                  local_430 = (allocator_type *)
                              CONCAT44(local_430._4_4_,
                                       *(float *)((long)pSVar11[uVar17].positions[0].m_data + 0xc));
                  local_438 = (allocator_type *)
                              CONCAT44(local_438._4_4_,
                                       *(float *)((long)(pSVar11[uVar17].positions + 1) + 0xc));
                  local_360._M_dataplus._M_p =
                       *(pointer *)
                        local_300.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar17].m_data;
                  local_3e8.m_data =
                       *(int (*) [2])
                        (local_300.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar17].m_data + 2);
                  bVar7 = (local_3d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [uVar17 >> 6] & 1L << ((byte)uVar17 & 0x3f)) == 0;
                  uVar20 = (ulong)(uint)fVar46;
                  if (bVar7) {
                    uVar20 = local_598 & 0xffffffff;
                  }
                  fVar8 = (float)(int)(short)local_c8.
                                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar17].
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar20];
                  local_478.m_data[1] = fVar8;
                  local_478.m_data[0] = fVar46;
                  if (bVar7) {
                    local_478.m_data[1] = (float)local_598;
                    local_478.m_data[0] = fVar8;
                  }
                  local_3dc = (ulong)CONCAT14(!bVar7,(uint)bVar7);
                  memset(local_2e8 + 8,0,0xf0);
                  local_440 = (allocator_type *)
                              CONCAT44(local_440._4_4_,(float)(int)(uint)local_408._M_dataplus._M_p)
                  ;
                  local_2e8._0_8_ = uVar17 & 0xffffffff;
                  local_448 = (allocator_type *)
                              CONCAT44(local_448._4_4_,(float)(int)local_408._M_dataplus._M_p._4_4_)
                  ;
                  iVar22 = -1;
                  local_450 = (allocator_type *)
                              CONCAT44(local_450._4_4_,(float)(int)local_408._M_string_length);
                  local_458 = uVar17;
                  do {
                    local_168._0_4_ = R;
                    local_168._4_4_ = SNORM_INT8;
                    lVar9 = 0;
                    do {
                      *(int *)(local_168 + lVar9 * 4) =
                           *(int *)((long)&local_3dc + lVar9 * 4) * iVar22;
                      lVar9 = lVar9 + 1;
                    } while (lVar9 == 1);
                    local_540 = 0;
                    lVar9 = 0;
                    do {
                      *(int *)((long)&local_540 + lVar9 * 4) =
                           *(int *)(local_168 + lVar9 * 4) + (int)local_478.m_data[lVar9];
                      lVar9 = lVar9 + 1;
                    } while (lVar9 == 1);
                    if (((((int)local_540 < surface->m_width && -1 < (int)local_540) &&
                         (-1 < local_540)) && (local_540._4_4_ < surface->m_height)) &&
                       ((*(uint *)((long)(surface->m_pixels).m_ptr +
                                  (long)(local_540._4_4_ * surface->m_width + (int)local_540) * 4) &
                        0xffffff) == 0)) {
                      __args = (SingleSampleWideLineCandidate *)0x21;
                      uVar17 = local_530;
                    }
                    else {
                      (anonymous_namespace)::
                      calcSingleSampleLineInterpolationRangeWithWeightEquation<tcu::(anonymous_namespace)::LineInterpolationRange(*)(tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&)>
                                ((Vec2 *)local_168,local_430._0_4_,(Vec2 *)&local_360,
                                 local_438._0_4_,&local_3e8,(int)&local_540,
                                 (_func_LineInterpolationRange_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr
                                  *)(ulong)(uint)local_528->subpixelBits);
                      fVar8 = 1.0;
                      if ((float)uStack_160 <= 1.0) {
                        fVar8 = (float)uStack_160;
                      }
                      pSVar11 = (scene->lines).
                                super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      local_5c8 = (undefined1  [8])0x0;
                      TStack_5c0.order = R;
                      TStack_5c0.type = SNORM_INT8;
                      lVar9 = 0;
                      do {
                        *(float *)(local_5c8 + lVar9 * 4) =
                             *(float *)((long)pSVar11->positions[0].m_data + lVar9 * 4 + local_370)
                             * (float)(~-(uint)((float)uStack_160 < 0.0) & (uint)fVar8);
                        lVar9 = lVar9 + 1;
                      } while (lVar9 != 4);
                      fVar8 = 1.0;
                      if (uStack_160._4_4_ <= 1.0) {
                        fVar8 = uStack_160._4_4_;
                      }
                      local_578._M_dataplus._M_p = (pointer)0x0;
                      local_578._M_string_length = 0;
                      lVar9 = 0;
                      do {
                        *(float *)((long)&local_578._M_dataplus._M_p + lVar9 * 4) =
                             *(float *)((long)pSVar11->positions[0].m_data + lVar9 * 4 + local_378)
                             * (float)(~-(uint)(uStack_160._4_4_ < 0.0) & (uint)fVar8);
                        lVar9 = lVar9 + 1;
                      } while (lVar9 != 4);
                      local_518 = (undefined1  [8])0x0;
                      TStack_510.order = R;
                      TStack_510.type = SNORM_INT8;
                      lVar9 = 0;
                      do {
                        *(float *)(local_518 + lVar9 * 4) =
                             *(float *)(local_5c8 + lVar9 * 4) +
                             *(float *)((long)&local_578._M_dataplus._M_p + lVar9 * 4);
                        lVar9 = lVar9 + 1;
                      } while (lVar9 != 4);
                      fVar8 = 1.0;
                      if ((float)local_168._0_4_ <= 1.0) {
                        fVar8 = (float)local_168._0_4_;
                      }
                      local_578._M_dataplus._M_p = (pointer)0x0;
                      local_578._M_string_length._0_4_ = R;
                      local_578._M_string_length._4_4_ = SNORM_INT8;
                      lVar9 = 0;
                      do {
                        *(float *)((long)&local_578._M_dataplus._M_p + lVar9 * 4) =
                             *(float *)((long)pSVar11->positions[0].m_data + lVar9 * 4 + local_370)
                             * (float)(~-(uint)((float)local_168._0_4_ < 0.0) & (uint)fVar8);
                        lVar9 = lVar9 + 1;
                      } while (lVar9 != 4);
                      fVar8 = 1.0;
                      if ((float)local_168._4_4_ <= 1.0) {
                        fVar8 = (float)local_168._4_4_;
                      }
                      local_498._M_dataplus._M_p = (pointer)0x0;
                      local_498._M_string_length = 0;
                      lVar9 = 0;
                      do {
                        *(float *)((long)&local_498._M_dataplus._M_p + lVar9 * 4) =
                             *(float *)((long)pSVar11->positions[0].m_data + lVar9 * 4 + local_378)
                             * (float)(~-(uint)((float)local_168._4_4_ < 0.0) & (uint)fVar8);
                        lVar9 = lVar9 + 1;
                      } while (lVar9 != 4);
                      local_5c8 = (undefined1  [8])0x0;
                      TStack_5c0.order = R;
                      TStack_5c0.type = SNORM_INT8;
                      lVar9 = 0;
                      do {
                        *(float *)(local_5c8 + lVar9 * 4) =
                             *(float *)((long)&local_578._M_dataplus._M_p + lVar9 * 4) +
                             *(float *)((long)&local_498._M_dataplus._M_p + lVar9 * 4);
                        lVar9 = lVar9 + 1;
                      } while (lVar9 != 4);
                      local_548 = (allocator_type *)CONCAT44(local_548._4_4_,local_518._0_4_);
                      fVar47 = (float)local_518._0_4_ * local_440._0_4_;
                      fVar8 = local_440._0_4_;
                      if (fVar47 <= local_440._0_4_) {
                        fVar8 = fVar47;
                      }
                      fVar8 = (float)(~-(uint)(fVar47 < 0.0) & (uint)fVar8);
                      local_3a8 = ZEXT416((uint)fVar8);
                      local_550 = (allocator_type *)CONCAT44(local_550._4_4_,local_518._4_4_);
                      fVar48 = (float)local_518._4_4_ * local_448._0_4_;
                      fVar47 = local_448._0_4_;
                      if (fVar48 <= local_448._0_4_) {
                        fVar47 = fVar48;
                      }
                      local_588 = ZEXT416(~-(uint)(fVar48 < 0.0) & (uint)fVar47);
                      local_520 = (allocator_type *)CONCAT44(local_520._4_4_,TStack_510.order);
                      fVar48 = (float)TStack_510.order * local_450._0_4_;
                      fVar47 = local_450._0_4_;
                      if (fVar48 <= local_450._0_4_) {
                        fVar47 = fVar48;
                      }
                      local_4d8 = ZEXT416(~-(uint)(fVar48 < 0.0) & (uint)fVar47);
                      local_418 = (allocator_type *)CONCAT44(local_418._4_4_,local_5c8._0_4_);
                      fVar48 = (float)local_5c8._0_4_ * local_440._0_4_;
                      fVar47 = local_440._0_4_;
                      if (fVar48 <= local_440._0_4_) {
                        fVar47 = fVar48;
                      }
                      local_4b8 = ZEXT416(~-(uint)(fVar48 < 0.0) & (uint)fVar47);
                      local_420 = (allocator_type *)CONCAT44(local_420._4_4_,local_5c8._4_4_);
                      fVar48 = (float)local_5c8._4_4_ * local_448._0_4_;
                      fVar47 = local_448._0_4_;
                      if (fVar48 <= local_448._0_4_) {
                        fVar47 = fVar48;
                      }
                      local_4c8 = ZEXT416(~-(uint)(fVar48 < 0.0) & (uint)fVar47);
                      local_428 = (allocator_type *)CONCAT44(local_428._4_4_,TStack_5c0.order);
                      fVar48 = (float)TStack_5c0.order * local_450._0_4_;
                      fVar47 = local_450._0_4_;
                      if (fVar48 <= local_450._0_4_) {
                        fVar47 = fVar48;
                      }
                      local_468 = ZEXT416(~-(uint)(fVar48 < 0.0) & (uint)fVar47);
                      fVar8 = floorf(fVar8);
                      fVar47 = floorf((float)local_588._0_4_);
                      local_5a0._0_4_ = fVar47;
                      fVar47 = floorf((float)local_4d8._0_4_);
                      iVar42 = (int)local_5a0._0_4_;
                      fVar48 = ceilf((float)local_4b8._0_4_);
                      iVar41 = (int)fVar48;
                      fVar48 = ceilf((float)local_4c8._0_4_);
                      local_5a0 = (allocator_type *)CONCAT44(local_5a0._4_4_,fVar48);
                      fVar48 = ceilf((float)local_468._0_4_);
                      iVar16 = (int)fVar48;
                      if (((int)local_340._M_dataplus._M_p < (int)fVar8) ||
                         (local_340._M_dataplus._M_p._4_4_ < iVar42)) {
                        __args = (SingleSampleWideLineCandidate *)0x0;
                        uVar17 = local_530;
                        if (local_5ec < 4) goto LAB_00a89262;
                      }
                      else {
                        bVar7 = (int)local_340._M_string_length < (int)fVar47;
                        bVar1 = (int)local_5a0._0_4_ < local_340._M_dataplus._M_p._4_4_;
                        uVar17 = local_530 & 0xff;
                        if (((int)local_340._M_string_length <= iVar16 && !bVar7) &&
                            (!bVar1 && (int)local_340._M_dataplus._M_p <= iVar41)) {
                          uVar17 = 1;
                        }
                        __args = (SingleSampleWideLineCandidate *)0x0;
                        if (((int)local_340._M_string_length <= iVar16 && !bVar7) &&
                            (!bVar1 && (int)local_340._M_dataplus._M_p <= iVar41)) {
                          __args = (SingleSampleWideLineCandidate *)0x1f;
                        }
                        if (local_5ec < 4 &&
                            ((iVar16 < (int)local_340._M_string_length || bVar7) ||
                            (bVar1 || iVar41 < (int)local_340._M_dataplus._M_p))) {
LAB_00a89262:
                          lVar9 = (long)(int)local_2e8._4_4_;
                          local_2e8._4_4_ = local_2e8._4_4_ + SNORM_INT16;
                          *(long *)(local_2e8 + lVar9 * 0x50 + 8) = local_540;
                          aiStack_2d4[lVar9 * 0x14 + -1] = (int)fVar8;
                          aiStack_2d4[lVar9 * 0x14] = iVar42;
                          aiStack_2d4[lVar9 * 0x14 + 1] = (int)fVar47;
                          aiStack_2d4[lVar9 * 0x14 + 2] = iVar41;
                          aiStack_2c0[lVar9 * 0x14 + -2] = (int)local_5a0._0_4_;
                          aiStack_2c0[lVar9 * 0x14 + -1] = iVar16;
                          aiStack_2c0[lVar9 * 0x14] = local_3a8._0_4_;
                          aiStack_2c0[lVar9 * 0x14 + 1] = local_588._0_4_;
                          auStack_2a8[lVar9 * 0x14 + -4] = local_4d8._0_4_;
                          auStack_2a8[lVar9 * 0x14 + -3] = local_4b8._0_4_;
                          auStack_2a8[lVar9 * 0x14 + -2] = local_4c8._0_4_;
                          auStack_2a8[lVar9 * 0x14 + -1] = local_468._0_4_;
                          auStack_2a8[lVar9 * 0x14] = local_548._0_4_;
                          auStack_2a8[lVar9 * 0x14 + 1] = local_550._0_4_;
                          auStack_2a8[lVar9 * 0x14 + 2] = local_520._0_4_;
                          auStack_2a8[lVar9 * 0x14 + 3] = local_418._0_4_;
                          auStack_2a8[lVar9 * 0x14 + 4] = local_420._0_4_;
                          auStack_2a8[lVar9 * 0x14 + 5] = local_428._0_4_;
                          __args = (SingleSampleWideLineCandidate *)0x0;
                          uVar17 = local_530;
                        }
                      }
                    }
                    local_530 = uVar17;
                    uVar17 = local_458;
                    paVar24 = local_558;
                  } while ((((int)__args == 0x21) || ((int)__args == 0)) &&
                          (iVar22 = iVar22 + 1, iVar22 != 2));
                  if ((local_530 & 1) != 0) break;
                  if ((local_5ec < 4) && (0 < (int)local_2e8._4_4_)) {
                    if (local_558 == local_5a8) {
                      if ((long)local_558 - (long)local_5f8 == 0x7ffffffffffffff8) {
                        std::__throw_length_error("vector::_M_realloc_insert");
                      }
                      lVar9 = (long)local_558 - (long)local_5f8 >> 3;
                      uVar20 = lVar9 * -0x1084210842108421;
                      uVar17 = uVar20;
                      if (local_558 == local_5f8) {
                        uVar17 = 1;
                      }
                      local_d0 = uVar17 + uVar20;
                      if (0x84210842108420 < local_d0) {
                        local_d0 = 0x84210842108421;
                      }
                      if (CARRY8(uVar17,uVar20)) {
                        local_d0 = 0x84210842108421;
                      }
                      if (local_d0 == 0) {
                        paVar27 = (allocator_type *)0x0;
                      }
                      else {
                        paVar27 = (allocator_type *)operator_new(local_d0 * 0xf8);
                        __args = extraout_RDX;
                      }
                      std::
                      allocator_traits<std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>>
                      ::
                      construct<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,tcu::(anonymous_namespace)::SingleSampleWideLineCandidate_const&>
                                (paVar27 + lVar9 * 8,(SingleSampleWideLineCandidate *)local_2e8,
                                 __args);
                      paVar40 = paVar27;
                      if (paVar24 != local_5f8) {
                        local_468._0_8_ = paVar27 + 8;
                        paVar24 = local_5f8 + 0x34;
                        local_4c8._0_8_ = paVar24;
                        paVar12 = local_5f8;
                        paVar13 = local_5f8 + 8;
                        paVar21 = local_5f8 + 0x40;
                        paVar23 = paVar27 + 0x40;
                        paVar26 = paVar27 + 0x10;
                        paVar29 = paVar27 + 0x1c;
                        paVar31 = local_5f8 + 0x1c;
                        paVar33 = paVar27 + 0x28;
                        paVar34 = local_5f8 + 0x28;
                        paVar35 = paVar27 + 0x34;
                        paVar36 = paVar27 + 0x4c;
                        paVar37 = local_5f8 + 0x10;
                        paVar38 = local_5f8 + 0x4c;
                        do {
                          local_450 = paVar38;
                          local_550 = paVar37;
                          local_448 = paVar36;
                          local_430 = paVar35;
                          local_428 = paVar34;
                          local_420 = paVar33;
                          local_418 = paVar31;
                          local_520 = paVar29;
                          local_548 = paVar26;
                          local_438 = paVar23;
                          local_440 = paVar21;
                          local_5a0 = paVar13;
                          local_3a8._0_8_ = paVar40;
                          *(undefined8 *)paVar40 = *(undefined8 *)paVar12;
                          local_4c8._0_8_ = paVar24;
                          lVar44 = 0;
                          paVar13 = local_450;
                          lVar9 = local_468._0_8_;
                          paVar21 = local_5a0;
                          paVar23 = local_440;
                          paVar26 = local_438;
                          paVar29 = local_548;
                          paVar31 = local_520;
                          paVar33 = local_418;
                          paVar34 = local_420;
                          paVar35 = local_428;
                          paVar36 = local_430;
                          paVar37 = local_448;
                          paVar38 = paVar24;
                          paVar43 = local_550;
                          do {
                            local_4d8._0_8_ = lVar44;
                            local_588._0_8_ = paVar13;
                            lVar45 = 0;
                            do {
                              *(undefined4 *)(lVar9 + lVar45 * 4) =
                                   *(undefined4 *)(paVar21 + lVar45 * 4);
                              lVar45 = lVar45 + 1;
                            } while (lVar45 == 1);
                            lVar45 = 0;
                            do {
                              *(undefined4 *)(paVar29 + lVar45 * 4) =
                                   *(undefined4 *)(paVar43 + lVar45 * 4);
                              lVar45 = lVar45 + 1;
                            } while (lVar45 != 3);
                            lVar45 = 0;
                            do {
                              *(undefined4 *)(paVar31 + lVar45 * 4) =
                                   *(undefined4 *)(paVar33 + lVar45 * 4);
                              lVar45 = lVar45 + 1;
                            } while (lVar45 != 3);
                            lVar45 = 0;
                            do {
                              *(undefined4 *)(paVar34 + lVar45 * 4) =
                                   *(undefined4 *)(paVar35 + lVar45 * 4);
                              lVar45 = lVar45 + 1;
                            } while (lVar45 != 3);
                            lVar45 = 0;
                            do {
                              *(undefined4 *)(paVar36 + lVar45 * 4) =
                                   *(undefined4 *)(paVar38 + lVar45 * 4);
                              lVar45 = lVar45 + 1;
                            } while (lVar45 != 3);
                            lVar45 = 0;
                            do {
                              *(undefined4 *)(paVar26 + lVar45 * 4) =
                                   *(undefined4 *)(paVar23 + lVar45 * 4);
                              lVar45 = lVar45 + 1;
                            } while (lVar45 != 3);
                            lVar45 = 0;
                            do {
                              *(undefined4 *)(paVar37 + lVar45 * 4) =
                                   *(undefined4 *)(paVar13 + lVar45 * 4);
                              lVar45 = lVar45 + 1;
                            } while (lVar45 != 3);
                            lVar44 = lVar44 + 1;
                            lVar9 = lVar9 + 0x50;
                            paVar21 = paVar21 + 0x50;
                            paVar29 = paVar29 + 0x50;
                            paVar43 = paVar43 + 0x50;
                            paVar31 = paVar31 + 0x50;
                            paVar33 = paVar33 + 0x50;
                            paVar34 = paVar34 + 0x50;
                            paVar35 = paVar35 + 0x50;
                            paVar36 = paVar36 + 0x50;
                            paVar38 = paVar38 + 0x50;
                            paVar26 = paVar26 + 0x50;
                            paVar23 = paVar23 + 0x50;
                            paVar37 = paVar37 + 0x50;
                            paVar13 = paVar13 + 0x50;
                          } while (lVar44 != 3);
                          paVar12 = paVar12 + 0xf8;
                          local_4b8._0_8_ = paVar12;
                          paVar40 = paVar40 + 0xf8;
                          local_468._0_8_ = local_468._0_8_ + 0xf8;
                          paVar24 = paVar24 + 0xf8;
                          paVar13 = local_5a0 + 0xf8;
                          paVar21 = local_440 + 0xf8;
                          paVar23 = local_438 + 0xf8;
                          paVar26 = local_548 + 0xf8;
                          paVar29 = local_520 + 0xf8;
                          paVar31 = local_418 + 0xf8;
                          paVar33 = local_420 + 0xf8;
                          paVar34 = local_428 + 0xf8;
                          paVar35 = local_430 + 0xf8;
                          paVar36 = local_448 + 0xf8;
                          paVar37 = local_550 + 0xf8;
                          paVar38 = local_450 + 0xf8;
                        } while (paVar12 != local_558);
                      }
                      local_380 = paVar27;
                      if (local_5f8 != (allocator_type *)0x0) {
                        operator_delete(local_5f8,(long)local_5a8 - (long)local_5f8);
                      }
                      local_558 = paVar40 + 0xf8;
                      local_5a8 = local_380 + local_d0 * 0xf8;
                      uVar17 = local_458;
                      local_5f8 = local_380;
                    }
                    else {
                      std::
                      allocator_traits<std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>>
                      ::
                      construct<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,tcu::(anonymous_namespace)::SingleSampleWideLineCandidate_const&>
                                (local_558,(SingleSampleWideLineCandidate *)local_2e8,__args);
                      local_558 = paVar24 + 0xf8;
                    }
                  }
                }
                uVar17 = uVar17 + 1;
                pSVar11 = (scene->lines).
                          super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_370 = local_370 + 0x40;
                local_378 = local_378 + 0x40;
              } while ((long)uVar17 <
                       (long)(int)((ulong)((long)(scene->lines).
                                                 super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)pSVar11) >> 6));
            }
            poVar39 = (ostringstream *)(local_2e8 + 8);
            if ((local_530 & 1) == 0) {
              local_5d4 = local_5d4 + 1;
              *(undefined4 *)
               ((long)local_398.m_pixels.m_ptr +
               (long)(local_398.m_width * (int)local_598 + (int)fVar46) * 4) = 0xff0000ff;
              local_5ec = local_5ec + 1;
              if (local_5ec < 4) {
                local_2e8._0_8_ = log;
                std::__cxx11::ostringstream::ostringstream(poVar39);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar39,"Found an invalid pixel at (",0x1b);
                std::ostream::operator<<(poVar39,(int)fVar46);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar39,",",1);
                std::ostream::operator<<(poVar39,(int)local_598);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar39,"), ",3);
                iVar22 = (int)((ulong)((long)local_558 - (long)local_5f8) >> 3);
                iVar16 = iVar22 * -0x42108421;
                std::ostream::operator<<(poVar39,iVar16);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar39," candidate reference value(s) found:\n",0x25);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar39,"\tPixel color:\t\t",0xf);
                RVar4.m_value = local_58c.m_value;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar39,"RGBA(",5);
                poVar14 = (ostream *)std::ostream::operator<<(poVar39,RVar4.m_value & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
                poVar14 = (ostream *)std::ostream::operator<<(poVar14,RVar4.m_value >> 8 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
                poVar14 = (ostream *)std::ostream::operator<<(poVar14,RVar4.m_value >> 0x10 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
                poVar14 = (ostream *)std::ostream::operator<<(poVar14,RVar4.m_value >> 0x18);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,")",1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar39,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar39,"\tNative color:\t\t",0x10);
                operator<<((ostream *)poVar39,(Vector<int,_3> *)&local_340);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar39,"\n",1);
                if (0 < iVar16) {
                  local_520 = (allocator_type *)(long)(iVar22 * -0x42108421);
                  local_4c8._0_8_ = local_5f8 + 0x10;
                  local_468._0_8_ = local_5f8 + 0x1c;
                  local_5a0 = local_5f8 + 0x28;
                  local_548 = local_5f8 + 0x34;
                  local_550 = local_5f8 + 0x40;
                  local_3a8._0_8_ = local_5f8 + 0x4c;
                  auVar2._8_8_ = 0;
                  auVar2._0_8_ = local_4b8._8_8_;
                  local_4b8 = auVar2 << 0x40;
                  do {
                    poVar14 = (ostream *)(local_2e8 + 8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,"\tCandidate line (line ",0x16);
                    local_4d8._0_8_ = local_5f8 + local_4b8._0_8_ * 0xf8;
                    std::ostream::operator<<(poVar14,*(int *)(local_5f8 + local_4b8._0_8_ * 0xf8));
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"):\n",3);
                    if (0 < *(int *)(local_4d8._0_8_ + 4)) {
                      local_4a0 = local_4d8._0_8_ + 8;
                      auVar3._8_8_ = 0;
                      auVar3._0_8_ = local_588._8_8_;
                      local_588 = auVar3 << 0x40;
                      paVar24 = local_550;
                      paVar27 = local_5a0;
                      lVar9 = local_4c8._0_8_;
                      paVar40 = local_548;
                      lVar44 = local_468._0_8_;
                      lVar45 = local_3a8._0_8_;
                      do {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_2e8 + 8),
                                   "\t\tCandidate interpolation point (index ",0x27);
                        std::ostream::operator<<(local_2e8 + 8,local_588._0_4_);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_2e8 + 8),"):\n",3);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_2e8 + 8),
                                   "\t\t\tRoot fragment position (non-replicated fragment): ",0x35);
                        operator<<((ostream *)(local_2e8 + 8),
                                   (Vector<int,_2> *)(local_588._0_8_ * 0x50 + local_4a0));
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_2e8 + 8),":\n",2);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_2e8 + 8),"\t\t\tReference native color min: ",
                                   0x1f);
                        local_518 = (undefined1  [8])0x0;
                        TStack_510 = (TextureFormat)((ulong)TStack_510 & 0xffffffff00000000);
                        uStack_160 = uStack_160 & 0xffffffff00000000;
                        local_168._0_4_ = R;
                        local_168._4_4_ = SNORM_INT8;
                        lVar15 = 0;
                        do {
                          iVar22 = *(int *)(lVar9 + lVar15 * 4);
                          iVar16 = *(int *)((long)&local_408._M_dataplus._M_p + lVar15 * 4);
                          if (iVar22 < iVar16) {
                            iVar16 = iVar22;
                          }
                          if (iVar22 < *(int *)(local_518 + lVar15 * 4)) {
                            iVar16 = *(int *)(local_518 + lVar15 * 4);
                          }
                          *(int *)(local_168 + lVar15 * 4) = iVar16;
                          lVar15 = lVar15 + 1;
                        } while (lVar15 != 3);
                        operator<<((ostream *)(local_2e8 + 8),(Vector<int,_3> *)local_168);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_2e8 + 8),"\n",1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_2e8 + 8),"\t\t\tReference native color max: ",
                                   0x1f);
                        local_578._M_dataplus._M_p = (pointer)0x0;
                        local_578._M_string_length = local_578._M_string_length & 0xffffffff00000000
                        ;
                        TStack_5c0 = (TextureFormat)((ulong)TStack_5c0 & 0xffffffff00000000);
                        local_5c8 = (undefined1  [8])0x0;
                        lVar15 = 0;
                        do {
                          iVar22 = *(int *)(lVar44 + lVar15 * 4);
                          iVar16 = *(int *)((long)&local_408._M_dataplus._M_p + lVar15 * 4);
                          if (iVar22 < iVar16) {
                            iVar16 = iVar22;
                          }
                          iVar41 = *(int *)((long)&local_578._M_dataplus._M_p + lVar15 * 4);
                          if (iVar22 < iVar41) {
                            iVar16 = iVar41;
                          }
                          *(int *)(local_5c8 + lVar15 * 4) = iVar16;
                          lVar15 = lVar15 + 1;
                        } while (lVar15 != 3);
                        operator<<((ostream *)(local_2e8 + 8),(Vector<int,_3> *)local_5c8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_2e8 + 8),"\n",1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_2e8 + 8),"\t\t\tReference native float min: ",
                                   0x1f);
                        local_360._M_dataplus._M_p = (pointer)0x0;
                        local_360._M_string_length = local_360._M_string_length & 0xffffffff00000000
                        ;
                        local_3e0 = 0;
                        local_3e8.m_data[0] = 0;
                        local_3e8.m_data[1] = 0;
                        lVar15 = 0;
                        do {
                          local_3e8.m_data[lVar15] =
                               (int)(float)*(int *)((long)&local_408._M_dataplus._M_p + lVar15 * 4);
                          lVar15 = lVar15 + 1;
                        } while (lVar15 != 3);
                        local_498._M_string_length = local_498._M_string_length & 0xffffffff00000000
                        ;
                        local_498._M_dataplus._M_p = (pointer)0x0;
                        lVar15 = 0;
                        do {
                          fVar8 = *(float *)(paVar27 + lVar15 * 4);
                          fVar47 = *(float *)((long)&local_360._M_dataplus._M_p + lVar15 * 4);
                          fVar48 = (float)local_3e8.m_data[lVar15];
                          if (fVar8 <= (float)local_3e8.m_data[lVar15]) {
                            fVar48 = fVar8;
                          }
                          uVar19 = -(uint)(fVar8 < fVar47);
                          *(uint *)((long)&local_498._M_dataplus._M_p + lVar15 * 4) =
                               uVar19 & (uint)fVar47 | ~uVar19 & (uint)fVar48;
                          lVar15 = lVar15 + 1;
                        } while (lVar15 != 3);
                        operator<<((ostream *)(local_2e8 + 8),(Vector<float,_3> *)&local_498);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_2e8 + 8),"\n",1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_2e8 + 8),"\t\t\tReference native float max: ",
                                   0x1f);
                        local_3dc = 0;
                        local_3d4 = 0;
                        local_538 = 0;
                        local_540 = 0;
                        lVar15 = 0;
                        do {
                          *(float *)((long)&local_540 + lVar15 * 4) =
                               (float)*(int *)((long)&local_408._M_dataplus._M_p + lVar15 * 4);
                          lVar15 = lVar15 + 1;
                        } while (lVar15 != 3);
                        local_478.m_data[2] = 0.0;
                        local_478.m_data[0] = 0.0;
                        local_478.m_data[1] = 0.0;
                        lVar15 = 0;
                        do {
                          fVar8 = *(float *)(paVar40 + lVar15 * 4);
                          fVar47 = *(float *)((long)&local_3dc + lVar15 * 4);
                          fVar48 = *(float *)((long)&local_540 + lVar15 * 4);
                          if (fVar8 <= fVar48) {
                            fVar48 = fVar8;
                          }
                          uVar19 = -(uint)(fVar8 < fVar47);
                          local_478.m_data[lVar15] =
                               (float)(uVar19 & (uint)fVar47 | ~uVar19 & (uint)fVar48);
                          lVar15 = lVar15 + 1;
                        } while (lVar15 != 3);
                        operator<<((ostream *)(local_2e8 + 8),&local_478);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_2e8 + 8),"\n",1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_2e8 + 8),"\t\t\tFmin:\t",9);
                        local_8c = 0;
                        local_84 = 0;
                        local_98 = 0x3f8000003f800000;
                        local_90 = 0x3f800000;
                        local_310.m_data[2] = 0.0;
                        local_310.m_data[0] = 0.0;
                        local_310.m_data[1] = 0.0;
                        lVar15 = 0;
                        do {
                          fVar8 = *(float *)(paVar24 + lVar15 * 4);
                          fVar47 = *(float *)((long)&local_8c + lVar15 * 4);
                          fVar48 = *(float *)((long)&local_98 + lVar15 * 4);
                          if (fVar8 <= fVar48) {
                            fVar48 = fVar8;
                          }
                          uVar19 = -(uint)(fVar8 < fVar47);
                          local_310.m_data[lVar15] =
                               (float)(uVar19 & (uint)fVar47 | ~uVar19 & (uint)fVar48);
                          lVar15 = lVar15 + 1;
                        } while (lVar15 != 3);
                        operator<<((ostream *)(local_2e8 + 8),&local_310);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_2e8 + 8),"\n",1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_2e8 + 8),"\t\t\tFmax:\t",9);
                        local_a4 = 0;
                        local_9c = 0;
                        local_b0 = 0x3f8000003f800000;
                        local_a8 = 0x3f800000;
                        local_320.m_data[2] = 0.0;
                        local_320.m_data[0] = 0.0;
                        local_320.m_data[1] = 0.0;
                        lVar15 = 0;
                        do {
                          fVar8 = *(float *)(lVar45 + lVar15 * 4);
                          fVar47 = *(float *)((long)&local_a4 + lVar15 * 4);
                          fVar48 = *(float *)((long)&local_b0 + lVar15 * 4);
                          if (fVar8 <= fVar48) {
                            fVar48 = fVar8;
                          }
                          uVar19 = -(uint)(fVar8 < fVar47);
                          local_320.m_data[lVar15] =
                               (float)(uVar19 & (uint)fVar47 | ~uVar19 & (uint)fVar48);
                          lVar15 = lVar15 + 1;
                        } while (lVar15 != 3);
                        operator<<((ostream *)(local_2e8 + 8),&local_320);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_2e8 + 8),"\n",1);
                        lVar15 = local_588._0_8_ + 1;
                        lVar9 = lVar9 + 0x50;
                        lVar44 = lVar44 + 0x50;
                        paVar27 = paVar27 + 0x50;
                        paVar40 = paVar40 + 0x50;
                        paVar24 = paVar24 + 0x50;
                        lVar45 = lVar45 + 0x50;
                        local_588._0_8_ = lVar15;
                      } while (lVar15 < *(int *)(local_4d8._0_8_ + 4));
                    }
                    lVar9 = local_4b8._0_8_ + 1;
                    local_4c8._0_8_ = local_4c8._0_8_ + 0xf8;
                    local_468._0_8_ = local_468._0_8_ + 0xf8;
                    local_5a0 = local_5a0 + 0xf8;
                    local_548 = local_548 + 0xf8;
                    local_550 = local_550 + 0xf8;
                    local_3a8._0_8_ = local_3a8._0_8_ + 0xf8;
                    local_4b8._0_8_ = lVar9;
                  } while (lVar9 < (long)local_520);
                }
                MessageBuilder::operator<<
                          ((MessageBuilder *)local_2e8,(EndMessageToken *)&TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_2e8 + 8));
                std::ios_base::~ios_base(local_270);
              }
            }
          }
          if (local_5f8 != (allocator_type *)0x0) {
            operator_delete(local_5f8,(long)local_5a8 - (long)local_5f8);
          }
          fVar46 = (float)((int)fVar46 + 1);
          iVar22 = surface->m_width;
          local_410 = (ulong)((int)local_410 + 1);
        } while ((int)fVar46 < iVar22 + -1);
      }
      uVar19 = (int)local_598 + 1;
      local_598 = (ulong)uVar19;
    } while ((int)uVar19 < surface->m_height + -1);
  }
  if (4 < local_5ec) {
    poVar39 = (ostringstream *)(local_2e8 + 8);
    local_2e8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar39);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar39,"Omitted ",8);
    std::ostream::operator<<(poVar39,local_5ec + -4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar39," pixel error description(s).",0x1c);
    MessageBuilder::operator<<((MessageBuilder *)local_2e8,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar39);
    std::ios_base::~ios_base(local_270);
  }
  poVar39 = (ostringstream *)(local_2e8 + 8);
  iVar22 = (int)log;
  if (local_5d4 == 0) {
    local_2e8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar39);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar39,"No invalid pixels found.",0x18);
    MessageBuilder::operator<<((MessageBuilder *)local_2e8,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar39);
    std::ios_base::~ios_base(local_270);
    local_2e8._0_4_ = S;
    local_2e8._4_4_ = SNORM_INT8;
    local_518 = (undefined1  [8])&local_508;
    local_518 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_518,(ulong)local_2e8);
    local_508._M_allocated_capacity = local_2e8._0_8_;
    *(undefined8 *)local_518 = 0x6163696669726556;
    *(char *)((long)local_518 + 8) = 't';
    *(char *)((long)local_518 + 9) = 'i';
    *(char *)((long)local_518 + 10) = 'o';
    *(char *)((long)local_518 + 0xb) = 'n';
    *(char *)((long)local_518 + 0xc) = ' ';
    *(char *)((long)local_518 + 0xd) = 'r';
    *(char *)((long)local_518 + 0xe) = 'e';
    *(char *)((long)local_518 + 0xf) = 's';
    *(char *)((long)local_518 + 0xf) = 's';
    *(char *)((long)local_518 + 0x10) = 'u';
    *(char *)((long)local_518 + 0x11) = 'l';
    *(char *)((long)local_518 + 0x12) = 't';
    TStack_510.order = local_2e8._0_4_;
    TStack_510.type = local_2e8._4_4_;
    *(char *)((long)local_518 + local_2e8._0_8_) = '\0';
    local_2e8._0_4_ = S;
    local_2e8._4_4_ = SNORM_INT8;
    local_5c8 = (undefined1  [8])&local_5b8;
    local_5c8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_5c8,(ulong)local_2e8);
    local_5b8._M_allocated_capacity = local_2e8._0_8_;
    *(undefined8 *)local_5c8 = 0x6f20746c75736552;
    *(char *)((long)local_5c8 + 8) = 'f';
    *(char *)((long)local_5c8 + 9) = ' ';
    *(char *)((long)local_5c8 + 10) = 'r';
    *(char *)((long)local_5c8 + 0xb) = 'e';
    *(char *)((long)local_5c8 + 0xc) = 'n';
    *(char *)((long)local_5c8 + 0xd) = 'd';
    *(char *)((long)local_5c8 + 0xe) = 'e';
    *(char *)((long)local_5c8 + 0xf) = 'r';
    *(char *)((long)local_5c8 + 0xf) = 'r';
    *(char *)((long)local_5c8 + 0x10) = 'i';
    *(char *)((long)local_5c8 + 0x11) = 'n';
    *(char *)((long)local_5c8 + 0x12) = 'g';
    TStack_5c0.order = local_2e8._0_4_;
    TStack_5c0.type = local_2e8._4_4_;
    *(char *)((long)local_5c8 + local_2e8._0_8_) = '\0';
    LogImageSet::LogImageSet((LogImageSet *)local_168,(string *)local_518,(string *)local_5c8);
    TestLog::startImageSet(log,(char *)local_168,local_148._M_p);
    local_578._M_string_length._0_4_ = RA;
    local_578._M_string_length._4_4_ = SNORM_INT8;
    local_578.field_2._M_allocated_capacity._0_7_ = 0x746c75736552;
    local_498.field_2._M_allocated_capacity._0_4_ = 0x75736552;
    local_498.field_2._M_allocated_capacity._4_2_ = 0x746c;
    local_498._M_string_length = 6;
    local_498.field_2._M_local_buf[6] = '\0';
    pSVar10 = surface;
    local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    LogImage::LogImage((LogImage *)local_2e8,&local_578,&local_498,surface,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_2e8,iVar22,__buf_01,(size_t)pSVar10);
    TestLog::endImageSet(log);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_p != &local_2b8) {
      operator_delete(local_2c8._M_p,local_2b8._M_allocated_capacity + 1);
    }
    if (local_2e8._0_8_ != (long)local_2e8 + 0x10) {
      operator_delete((void *)local_2e8._0_8_,(ulong)(stack0xfffffffffffffd28 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p,
                      CONCAT17(local_498.field_2._M_local_buf[7],
                               CONCAT16(local_498.field_2._M_local_buf[6],
                                        CONCAT24(local_498.field_2._M_allocated_capacity._4_2_,
                                                 local_498.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      operator_delete(local_578._M_dataplus._M_p,
                      (ulong)(local_578.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_p != local_138) {
      operator_delete(local_148._M_p,local_138[0]._M_allocated_capacity + 1);
    }
    if (local_168 != (undefined1  [8])&local_158) {
      operator_delete((void *)local_168,local_158._M_allocated_capacity + 1);
    }
    if (local_5c8 != (undefined1  [8])&local_5b8) {
      operator_delete((void *)local_5c8,(ulong)(local_5b8._M_allocated_capacity + 1));
    }
    uVar30 = local_508._M_allocated_capacity;
    auVar32 = local_518;
    if (local_518 != (undefined1  [8])&local_508) goto LAB_00a8a838;
  }
  else {
    local_2e8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar39);
    std::ostream::operator<<(poVar39,local_5d4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar39," invalid pixel(s) found.",0x18);
    MessageBuilder::operator<<((MessageBuilder *)local_2e8,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar39);
    std::ios_base::~ios_base(local_270);
    local_2e8._0_4_ = S;
    local_2e8._4_4_ = SNORM_INT8;
    local_5c8 = (undefined1  [8])&local_5b8;
    local_5c8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_5c8,(ulong)local_2e8);
    local_5b8._M_allocated_capacity = local_2e8._0_8_;
    *(undefined8 *)local_5c8 = 0x6163696669726556;
    *(char *)((long)local_5c8 + 8) = 't';
    *(char *)((long)local_5c8 + 9) = 'i';
    *(char *)((long)local_5c8 + 10) = 'o';
    *(char *)((long)local_5c8 + 0xb) = 'n';
    *(char *)((long)local_5c8 + 0xc) = ' ';
    *(char *)((long)local_5c8 + 0xd) = 'r';
    *(char *)((long)local_5c8 + 0xe) = 'e';
    *(char *)((long)local_5c8 + 0xf) = 's';
    *(char *)((long)local_5c8 + 0xf) = 's';
    *(char *)((long)local_5c8 + 0x10) = 'u';
    *(char *)((long)local_5c8 + 0x11) = 'l';
    *(char *)((long)local_5c8 + 0x12) = 't';
    TStack_5c0.order = local_2e8._0_4_;
    TStack_5c0.type = local_2e8._4_4_;
    *(char *)((long)local_5c8 + local_2e8._0_8_) = '\0';
    local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
    local_2e8._0_4_ = S;
    local_2e8._4_4_ = SNORM_INT8;
    local_578._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_578,(ulong)local_2e8);
    local_578.field_2._M_allocated_capacity = local_2e8._0_8_;
    *(undefined8 *)local_578._M_dataplus._M_p = 0x6f20746c75736552;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p + 8) = 'f';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p + 9) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p + 10) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p + 0xb) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p + 0xc) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p + 0xd) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p + 0xe) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p + 0xf) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p + 0xf) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p + 0x10) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p + 0x11) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p + 0x12) = 'g';
    local_578._M_string_length = local_2e8._0_8_;
    local_578._M_dataplus._M_p[local_2e8._0_8_] = '\0';
    LogImageSet::LogImageSet((LogImageSet *)local_518,(string *)local_5c8,&local_578);
    TestLog::startImageSet(log,(char *)local_518,local_4f8._M_p);
    local_498.field_2._M_allocated_capacity._0_4_ = 0x75736552;
    local_498.field_2._M_allocated_capacity._4_2_ = 0x746c;
    local_498._M_string_length = 6;
    local_498.field_2._M_local_buf[6] = '\0';
    local_340.field_2._M_allocated_capacity._0_4_ = 0x75736552;
    local_340.field_2._M_allocated_capacity._4_2_ = 0x746c;
    local_340._M_string_length = 6;
    local_340.field_2._M_local_buf[6] = '\0';
    pSVar10 = surface;
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    LogImage::LogImage((LogImage *)local_2e8,&local_498,&local_340,surface,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_2e8,iVar22,__buf,(size_t)pSVar10);
    local_408.field_2._M_allocated_capacity = 0x73614d726f727245;
    local_408.field_2._8_2_ = 0x6b;
    local_408._M_string_length = 9;
    local_360.field_2._M_allocated_capacity = 0x73614d726f727245;
    local_360.field_2._8_2_ = 0x6b;
    local_360._M_string_length = 9;
    pSVar10 = &local_398;
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    LogImage::LogImage((LogImage *)local_168,&local_408,&local_360,pSVar10,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_168,iVar22,__buf_00,(size_t)pSVar10);
    TestLog::endImageSet(log);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_p != local_138) {
      operator_delete(local_148._M_p,local_138[0]._M_allocated_capacity + 1);
    }
    if (local_168 != (undefined1  [8])&local_158) {
      operator_delete((void *)local_168,local_158._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_p != &local_2b8) {
      operator_delete(local_2c8._M_p,local_2b8._M_allocated_capacity + 1);
    }
    if (local_2e8._0_8_ != (long)local_2e8 + 0x10) {
      operator_delete((void *)local_2e8._0_8_,(ulong)(stack0xfffffffffffffd28 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,
                      CONCAT17(local_340.field_2._M_local_buf[7],
                               CONCAT16(local_340.field_2._M_local_buf[6],
                                        CONCAT24(local_340.field_2._M_allocated_capacity._4_2_,
                                                 local_340.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p,
                      CONCAT17(local_498.field_2._M_local_buf[7],
                               CONCAT16(local_498.field_2._M_local_buf[6],
                                        CONCAT24(local_498.field_2._M_allocated_capacity._4_2_,
                                                 local_498.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_p != &local_4e8) {
      operator_delete(local_4f8._M_p,local_4e8._M_allocated_capacity + 1);
    }
    if (local_518 != (undefined1  [8])&local_508) {
      operator_delete((void *)local_518,(ulong)(local_508._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      operator_delete(local_578._M_dataplus._M_p,
                      (ulong)(local_578.field_2._M_allocated_capacity + 1));
    }
    uVar30 = local_5b8._M_allocated_capacity;
    auVar32 = local_5c8;
    if (local_5c8 != (undefined1  [8])&local_5b8) {
LAB_00a8a838:
      operator_delete((void *)auVar32,(ulong)(uVar30 + 1));
    }
  }
  TextureLevel::~TextureLevel(&local_80);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_c8);
  if (local_3d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_3d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_3d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_3d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_3d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_3d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_3d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_3d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_3d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_300.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_300.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_300.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_300.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Surface::~Surface(&local_398);
  if (local_5d4 == 0) {
    return LINEINTERPOLATION_STRICTLY_CORRECT;
  }
LAB_00a8a8d9:
  poVar39 = (ostringstream *)(local_2e8 + 8);
  local_2e8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar39);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar39,
             "Accurate verification failed, checking with projected weights (inaccurate equation).",
             0x54);
  MessageBuilder::operator<<((MessageBuilder *)local_2e8,(EndMessageToken *)&TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar39);
  std::ios_base::~ios_base(local_270);
  bVar7 = anon_unknown_3::verifyLineGroupPixelIndependentInterpolation
                    (surface,scene,local_528,log,LINEINTERPOLATION_PROJECTED);
  return LINEINTERPOLATION_INCORRECT - bVar7;
}

Assistant:

LineInterpolationMethod verifyLineGroupInterpolation (const tcu::Surface& surface, const LineSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log)
{
	const bool multisampled = args.numSamples != 0;

	if (multisampled)
	{
		if (verifyMultisampleLineGroupInterpolation(surface, scene, args, log))
			return LINEINTERPOLATION_STRICTLY_CORRECT;
		return LINEINTERPOLATION_INCORRECT;
	}
	else
	{
		const bool isNarrow = (scene.lineWidth == 1.0f);

		// accurate interpolation
		if (isNarrow)
		{
			if (verifySinglesampleNarrowLineGroupInterpolation(surface, scene, args, log))
				return LINEINTERPOLATION_STRICTLY_CORRECT;
		}
		else
		{
			if (verifySinglesampleWideLineGroupInterpolation(surface, scene, args, log))
				return LINEINTERPOLATION_STRICTLY_CORRECT;
		}

		// check with projected (inaccurate) interpolation
		log << tcu::TestLog::Message << "Accurate verification failed, checking with projected weights (inaccurate equation)." << tcu::TestLog::EndMessage;
		if (verifyLineGroupInterpolationWithProjectedWeights(surface, scene, args, log))
			return LINEINTERPOLATION_PROJECTED;

		return LINEINTERPOLATION_INCORRECT;
	}
}